

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Evaluator.cpp
# Opt level: O2

Object * punky::eval::Evaluator::eval_infix_expr
                   (Object *__return_storage_ptr__,TokenType *op,Object *left,Object *right)

{
  ObjectType OVar1;
  ObjectType OVar2;
  TokenType *type;
  ObjectType *type_00;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  OVar1 = left->m_type;
  OVar2 = right->m_type;
  if (OVar2 == Int && OVar1 == Int) {
    eval_int_infix_expr(__return_storage_ptr__,op,left,right);
  }
  else if (OVar2 == Boolean && OVar1 == Boolean) {
    eval_bool_infix_expr(__return_storage_ptr__,op,left,right);
  }
  else if (OVar1 == OVar2) {
    unknown_op_error(__return_storage_ptr__,op,left,right);
  }
  else {
    __return_storage_ptr__->m_type = Error;
    obj::type_to_string_abi_cxx11_(&local_60,(obj *)left,&left->m_type);
    std::operator+(&local_e0,"type mismatch: ",&local_60);
    std::operator+(&local_c0,&local_e0," ");
    tok::type_to_string_abi_cxx11_(&local_100,(tok *)op,type);
    std::operator+(&local_a0,&local_c0,&local_100);
    std::operator+(&local_80,&local_a0," ");
    obj::type_to_string_abi_cxx11_(&local_120,(obj *)right,type_00);
    std::operator+(&local_40,&local_80,&local_120);
    std::variant<std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                *)&__return_storage_ptr__->m_value,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Object Evaluator::eval_infix_expr(const TokenType& op, const Object& left, const Object& right)
{
    if (left.m_type == ObjectType::Int && right.m_type == ObjectType::Int)
        return eval_int_infix_expr(op, left, right);

    if (left.m_type == ObjectType::Boolean && right.m_type == ObjectType::Boolean)
        return eval_bool_infix_expr(op, left, right);

    if (left.m_type != right.m_type)
        return type_mismatch_error(op, left, right);

    return unknown_op_error(op, left, right);
}